

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_iterator.h
# Opt level: O0

node_iterator_base<const_YAML::detail::node> * __thiscall
YAML::detail::node_iterator_base<const_YAML::detail::node>::operator++
          (node_iterator_base<const_YAML::detail::node> *this)

{
  value vVar1;
  MapIter MVar2;
  node_iterator_base<const_YAML::detail::node> *in_RDI;
  node_iterator_base<const_YAML::detail::node> *in_stack_fffffffffffffff0;
  
  vVar1 = in_RDI->m_type;
  if (vVar1 != NoneType) {
    if (vVar1 == Sequence) {
      __gnu_cxx::
      __normal_iterator<YAML::detail::node_*const_*,_std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>_>
      ::operator++(&in_RDI->m_seqIt);
    }
    else if (vVar1 == Map) {
      MVar2._M_current = (pair<YAML::detail::node_*,_YAML::detail::node_*> *)in_RDI;
      __gnu_cxx::
      __normal_iterator<const_std::pair<YAML::detail::node_*,_YAML::detail::node_*>_*,_std::vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>_>
      ::operator++(&in_RDI->m_mapIt);
      MVar2 = increment_until_defined(in_stack_fffffffffffffff0,MVar2);
      (in_RDI->m_mapIt)._M_current = MVar2._M_current;
    }
  }
  return in_RDI;
}

Assistant:

node_iterator_base<V>& operator++() {
    switch (m_type) {
      case iterator_type::NoneType:
        break;
      case iterator_type::Sequence:
        ++m_seqIt;
        break;
      case iterator_type::Map:
        ++m_mapIt;
        m_mapIt = increment_until_defined(m_mapIt);
        break;
    }
    return *this;
  }